

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int JS_GetOwnPropertyNamesInternal
              (JSContext *ctx,JSPropertyEnum **ptab,uint32_t *plen,JSObject *p,int flags)

{
  byte bVar1;
  JSAtom JVar2;
  uint v;
  JSAtomStruct *pJVar3;
  JSClassExoticMethods *pJVar4;
  _func_int_JSContext_ptr_JSPropertyEnum_ptr_ptr_uint32_t_ptr_JSValue *p_Var5;
  JSObject *pJVar6;
  JSAtomKindEnum JVar7;
  BOOL BVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  JSShape *pJVar15;
  int iVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  JSValue JVar21;
  uint local_b8;
  uint32_t exotic_count;
  ulong local_b0;
  JSShape *local_a8;
  JSPropertyEnum *tab_exotic;
  JSObject *p_1;
  JSPropertyEnum *local_90;
  int local_84;
  uint local_80;
  uint32_t num_key;
  uint *local_78;
  JSPropertyEnum **local_70;
  JSPropertyDescriptor desc;
  
  *ptab = (JSPropertyEnum *)0x0;
  *plen = 0;
  exotic_count = 0;
  tab_exotic = (JSPropertyEnum *)0x0;
  pJVar15 = p->shape;
  local_a8 = (JSShape *)((ulong)local_a8 & 0xffffffff00000000);
  local_b0 = 0;
  local_b8 = 0;
  p_1 = p;
  local_78 = plen;
  local_70 = ptab;
  for (lVar14 = 0; lVar14 < pJVar15->prop_count; lVar14 = lVar14 + 1) {
    JVar2 = *(JSAtom *)(&pJVar15[1].header.field_0x4 + lVar14 * 8);
    if (JVar2 != 0) {
      uVar17 = (&pJVar15[1].header.ref_count)[lVar14 * 2];
      JVar7 = JS_AtomGetKind(ctx,JVar2);
      if ((((flags & 0x10U) == 0) || ((uVar17 & 0x10000000) != 0)) &&
         (((uint)flags >> (JVar7 & 0x1f) & 1) != 0)) {
        BVar8 = JS_AtomIsArrayIndex(ctx,&num_key,JVar2);
        if (BVar8 == 0) {
          if (JVar7 == JS_ATOM_KIND_STRING) {
            local_b0 = (ulong)((int)local_b0 + 1);
          }
          else {
            local_a8 = (JSShape *)CONCAT44(local_a8._4_4_,(int)local_a8 + 1);
          }
        }
        else {
          local_b8 = local_b8 + 1;
        }
      }
    }
  }
  bVar1 = (p_1->field_0).header.dummy1;
  iVar9 = 0;
  iVar10 = 0;
  iVar16 = (int)local_b0;
  if ((bVar1 & 4) != 0) {
    iVar9 = iVar10;
    if ((bVar1 & 8) == 0) {
      uVar12 = (ulong)(p_1->field_0).header.dummy2;
      if (uVar12 == 5) {
        iVar9 = 0;
        if ((flags & 1U) != 0) {
          uVar17 = 0;
          if (*(int *)((long)&p_1->u + 8) == -7) {
            uVar17 = *(uint *)&(((p_1->u).async_function_data)->header).field_0x4 & 0x7fffffff;
          }
          local_b8 = local_b8 + uVar17;
          iVar9 = 0;
        }
      }
      else {
        pJVar4 = ctx->rt->class_array[uVar12].exotic;
        if ((pJVar4 != (JSClassExoticMethods *)0x0) &&
           (p_Var5 = pJVar4->get_own_property_names,
           p_Var5 != (_func_int_JSContext_ptr_JSPropertyEnum_ptr_ptr_uint32_t_ptr_JSValue *)0x0)) {
          JVar21.tag = -1;
          JVar21.u.ptr = p_1;
          iVar9 = (*p_Var5)(ctx,&tab_exotic,&exotic_count,JVar21);
          if (iVar9 != 0) {
            return -1;
          }
          iVar9 = 0;
          for (uVar12 = 0; uVar12 < exotic_count; uVar12 = uVar12 + 1) {
            JVar2 = tab_exotic[uVar12].atom;
            JVar7 = JS_AtomGetKind(ctx,JVar2);
            if (((uint)flags >> (JVar7 & 0x1f) & 1) != 0) {
              if ((flags & 0x30U) == 0) {
                uVar17 = 0;
              }
              else {
                iVar10 = JS_GetOwnPropertyInternal(ctx,&desc,p_1,JVar2);
                if (iVar10 < 0) {
                  js_free_prop_enum(ctx,tab_exotic,exotic_count);
                  return -1;
                }
                if (iVar10 == 0) {
                  uVar17 = 0;
                }
                else {
                  uVar17 = (uint)desc.flags >> 2 & 1;
                  js_free_desc(ctx,&desc);
                }
                tab_exotic[uVar12].is_enumerable = uVar17;
              }
              iVar9 = iVar9 + (uint)(byte)((flags & 0x10U) == 0 | (byte)uVar17);
            }
          }
        }
      }
    }
    else if ((flags & 1U) != 0) {
      local_b8 = local_b8 + (p_1->u).array.count;
    }
  }
  pJVar6 = p_1;
  uVar17 = iVar16 + local_b8;
  local_80 = iVar9 + (int)local_a8 + uVar17;
  local_84 = 1;
  uVar12 = 1;
  if (1 < (int)local_80) {
    uVar12 = (ulong)local_80;
  }
  local_90 = (JSPropertyEnum *)js_malloc(ctx,uVar12 << 3);
  if (local_90 == (JSPropertyEnum *)0x0) {
    js_free_prop_enum(ctx,tab_exotic,exotic_count);
    return -1;
  }
  pJVar15 = pJVar6->shape;
  uVar20 = 0;
  uVar11 = local_b8;
  local_a8 = pJVar15;
  for (lVar14 = 0; uVar12 = (ulong)uVar17, (int)lVar14 < pJVar15->prop_count; lVar14 = lVar14 + 1) {
    v = *(uint *)(&pJVar15[1].header.field_0x4 + lVar14 * 8);
    if ((ulong)v != 0) {
      uVar18 = (&pJVar15[1].header.ref_count)[lVar14 * 2] & 0x10000000;
      local_b0 = uVar12;
      JVar7 = JS_AtomGetKind(ctx,v);
      if ((((flags & 0x10U) == 0) || (uVar18 != 0)) && (((uint)flags >> (JVar7 & 0x1f) & 1) != 0)) {
        BVar8 = JS_AtomIsArrayIndex(ctx,&num_key,v);
        uVar17 = (uint)local_b0;
        if (BVar8 == 0) {
          if (JVar7 == JS_ATOM_KIND_STRING) {
            uVar19 = uVar11;
            uVar11 = uVar11 + 1;
          }
          else {
            uVar19 = uVar17;
            uVar17 = uVar17 + 1;
          }
        }
        else {
          local_84 = 0;
          uVar19 = uVar20;
          uVar20 = uVar20 + 1;
        }
        if (0xd1 < (int)v) {
          pJVar3 = ctx->rt->atom_array[v];
          (pJVar3->header).ref_count = (pJVar3->header).ref_count + 1;
        }
        local_90[(int)uVar19].atom = v;
        local_90[(int)uVar19].is_enumerable = uVar18 >> 0x1c;
        pJVar15 = local_a8;
      }
      else {
        uVar17 = (uint)local_b0;
        pJVar15 = local_a8;
      }
    }
  }
  bVar1 = (p_1->field_0).header.dummy1;
  if ((bVar1 & 4) == 0) goto LAB_00119e19;
  if ((bVar1 & 8) == 0) {
    if ((p_1->field_0).header.dummy2 != 5) {
      for (uVar13 = 0; uVar13 < exotic_count; uVar13 = uVar13 + 1) {
        iVar9 = tab_exotic[uVar13].is_enumerable;
        JVar2 = tab_exotic[uVar13].atom;
        JVar7 = JS_AtomGetKind(ctx,JVar2);
        if ((((flags & 0x10U) == 0) || (iVar9 != 0)) && (((uint)flags >> (JVar7 & 0x1f) & 1) != 0))
        {
          local_90[uVar12].atom = JVar2;
          local_90[uVar12].is_enumerable = iVar9;
          uVar12 = (ulong)((int)uVar12 + 1);
        }
        else {
          JS_FreeAtom(ctx,JVar2);
        }
      }
      (*(ctx->rt->mf).js_free)(&ctx->rt->malloc_state,tab_exotic);
      goto LAB_00119e19;
    }
    if ((flags & 1U) == 0) goto LAB_00119e19;
    uVar17 = 0;
    if (*(int *)((long)&p_1->u + 8) == -7) {
      uVar17 = *(uint *)&(((p_1->u).async_function_data)->header).field_0x4 & 0x7fffffff;
    }
  }
  else {
    if ((flags & 1U) == 0) goto LAB_00119e19;
    uVar17 = (p_1->u).array.count;
  }
  uVar11 = 0;
  if ((int)uVar17 < 1) {
    uVar17 = uVar11;
  }
  while (uVar17 != 0) {
    local_90[uVar20].atom = uVar11 | 0x80000000;
    local_90[uVar20].is_enumerable = 1;
    uVar20 = uVar20 + 1;
    uVar11 = uVar11 + 1;
    uVar17 = uVar17 - 1;
  }
LAB_00119e19:
  if (local_84 == 0 && local_b8 != 0) {
    rqsort(local_90,(ulong)local_b8,8,num_keys_cmp,ctx);
  }
  *local_70 = local_90;
  *local_78 = local_80;
  return 0;
}

Assistant:

static int __exception JS_GetOwnPropertyNamesInternal(JSContext *ctx,
                                                      JSPropertyEnum **ptab,
                                                      uint32_t *plen,
                                                      JSObject *p, int flags)
{
    int i, j;
    JSShape *sh;
    JSShapeProperty *prs;
    JSPropertyEnum *tab_atom, *tab_exotic;
    JSAtom atom;
    uint32_t num_keys_count, str_keys_count, sym_keys_count, atom_count;
    uint32_t num_index, str_index, sym_index, exotic_count, exotic_keys_count;
    BOOL is_enumerable, num_sorted;
    uint32_t num_key;
    JSAtomKindEnum kind;
    
    /* clear pointer for consistency in case of failure */
    *ptab = NULL;
    *plen = 0;

    /* compute the number of returned properties */
    num_keys_count = 0;
    str_keys_count = 0;
    sym_keys_count = 0;
    exotic_keys_count = 0;
    exotic_count = 0;
    tab_exotic = NULL;
    sh = p->shape;
    for(i = 0, prs = get_shape_prop(sh); i < sh->prop_count; i++, prs++) {
        atom = prs->atom;
        if (atom != JS_ATOM_NULL) {
            is_enumerable = ((prs->flags & JS_PROP_ENUMERABLE) != 0);
            kind = JS_AtomGetKind(ctx, atom);
            if ((!(flags & JS_GPN_ENUM_ONLY) || is_enumerable) &&
                ((flags >> kind) & 1) != 0) {
                /* need to raise an exception in case of the module
                   name space (implicit GetOwnProperty) */
                if (unlikely((prs->flags & JS_PROP_TMASK) == JS_PROP_VARREF) &&
                    (flags & (JS_GPN_SET_ENUM | JS_GPN_ENUM_ONLY))) {
                    JSVarRef *var_ref = p->prop[i].u.var_ref;
                    if (unlikely(JS_IsUninitialized(*var_ref->pvalue))) {
                        JS_ThrowReferenceErrorUninitialized(ctx, prs->atom);
                        return -1;
                    }
                }
                if (JS_AtomIsArrayIndex(ctx, &num_key, atom)) {
                    num_keys_count++;
                } else if (kind == JS_ATOM_KIND_STRING) {
                    str_keys_count++;
                } else {
                    sym_keys_count++;
                }
            }
        }
    }

    if (p->is_exotic) {
        if (p->fast_array) {
            if (flags & JS_GPN_STRING_MASK) {
                num_keys_count += p->u.array.count;
            }
        } else if (p->class_id == JS_CLASS_STRING) {
            if (flags & JS_GPN_STRING_MASK) {
                num_keys_count += js_string_obj_get_length(ctx, JS_MKPTR(JS_TAG_OBJECT, p));
            }
        } else {
            const JSClassExoticMethods *em = ctx->rt->class_array[p->class_id].exotic;
            if (em && em->get_own_property_names) {
                if (em->get_own_property_names(ctx, &tab_exotic, &exotic_count,
                                               JS_MKPTR(JS_TAG_OBJECT, p)))
                    return -1;
                for(i = 0; i < exotic_count; i++) {
                    atom = tab_exotic[i].atom;
                    kind = JS_AtomGetKind(ctx, atom);
                    if (((flags >> kind) & 1) != 0) {
                        is_enumerable = FALSE;
                        if (flags & (JS_GPN_SET_ENUM | JS_GPN_ENUM_ONLY)) {
                            JSPropertyDescriptor desc;
                            int res;
                            /* set the "is_enumerable" field if necessary */
                            res = JS_GetOwnPropertyInternal(ctx, &desc, p, atom);
                            if (res < 0) {
                                js_free_prop_enum(ctx, tab_exotic, exotic_count);
                                return -1;
                            }
                            if (res) {
                                is_enumerable =
                                    ((desc.flags & JS_PROP_ENUMERABLE) != 0);
                                js_free_desc(ctx, &desc);
                            }
                            tab_exotic[i].is_enumerable = is_enumerable;
                        }
                        if (!(flags & JS_GPN_ENUM_ONLY) || is_enumerable) {
                            exotic_keys_count++;
                        }
                    }
                }
            }
        }
    }

    /* fill them */

    atom_count = num_keys_count + str_keys_count + sym_keys_count + exotic_keys_count;
    /* avoid allocating 0 bytes */
    tab_atom = js_malloc(ctx, sizeof(tab_atom[0]) * max_int(atom_count, 1));
    if (!tab_atom) {
        js_free_prop_enum(ctx, tab_exotic, exotic_count);
        return -1;
    }

    num_index = 0;
    str_index = num_keys_count;
    sym_index = str_index + str_keys_count;

    num_sorted = TRUE;
    sh = p->shape;
    for(i = 0, prs = get_shape_prop(sh); i < sh->prop_count; i++, prs++) {
        atom = prs->atom;
        if (atom != JS_ATOM_NULL) {
            is_enumerable = ((prs->flags & JS_PROP_ENUMERABLE) != 0);
            kind = JS_AtomGetKind(ctx, atom);
            if ((!(flags & JS_GPN_ENUM_ONLY) || is_enumerable) &&
                ((flags >> kind) & 1) != 0) {
                if (JS_AtomIsArrayIndex(ctx, &num_key, atom)) {
                    j = num_index++;
                    num_sorted = FALSE;
                } else if (kind == JS_ATOM_KIND_STRING) {
                    j = str_index++;
                } else {
                    j = sym_index++;
                }
                tab_atom[j].atom = JS_DupAtom(ctx, atom);
                tab_atom[j].is_enumerable = is_enumerable;
            }
        }
    }

    if (p->is_exotic) {
        int len;
        if (p->fast_array) {
            if (flags & JS_GPN_STRING_MASK) {
                len = p->u.array.count;
                goto add_array_keys;
            }
        } else if (p->class_id == JS_CLASS_STRING) {
            if (flags & JS_GPN_STRING_MASK) {
                len = js_string_obj_get_length(ctx, JS_MKPTR(JS_TAG_OBJECT, p));
            add_array_keys:
                for(i = 0; i < len; i++) {
                    tab_atom[num_index].atom = __JS_AtomFromUInt32(i);
                    if (tab_atom[num_index].atom == JS_ATOM_NULL) {
                        js_free_prop_enum(ctx, tab_atom, num_index);
                        return -1;
                    }
                    tab_atom[num_index].is_enumerable = TRUE;
                    num_index++;
                }
            }
        } else {
            /* Note: exotic keys are not reordered and comes after the object own properties. */
            for(i = 0; i < exotic_count; i++) {
                atom = tab_exotic[i].atom;
                is_enumerable = tab_exotic[i].is_enumerable;
                kind = JS_AtomGetKind(ctx, atom);
                if ((!(flags & JS_GPN_ENUM_ONLY) || is_enumerable) &&
                    ((flags >> kind) & 1) != 0) {
                    tab_atom[sym_index].atom = atom;
                    tab_atom[sym_index].is_enumerable = is_enumerable;
                    sym_index++;
                } else {
                    JS_FreeAtom(ctx, atom);
                }
            }
            js_free(ctx, tab_exotic);
        }
    }

    assert(num_index == num_keys_count);
    assert(str_index == num_keys_count + str_keys_count);
    assert(sym_index == atom_count);

    if (num_keys_count != 0 && !num_sorted) {
        rqsort(tab_atom, num_keys_count, sizeof(tab_atom[0]), num_keys_cmp,
               ctx);
    }
    *ptab = tab_atom;
    *plen = atom_count;
    return 0;
}